

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O0

void duckdb_je_psset_update_end(psset_t *psset,hpdata_t *ps)

{
  _Bool _Var1;
  psset_t *in_RSI;
  hpdata_t *in_RDI;
  psset_t *unaff_retaddr;
  hpdata_t *in_stack_ffffffffffffffe8;
  
  hpdata_updating_set((hpdata_t *)in_RSI,false);
  psset_stats_insert(in_RSI,in_stack_ffffffffffffffe8);
  _Var1 = hpdata_alloc_allowed_get((hpdata_t *)in_RSI);
  if (_Var1) {
    psset_alloc_container_insert(in_RSI,in_stack_ffffffffffffffe8);
  }
  psset_maybe_insert_purge_list(unaff_retaddr,in_RDI);
  _Var1 = hpdata_hugify_allowed_get((hpdata_t *)in_RSI);
  if ((!_Var1) || (_Var1 = hpdata_in_psset_hugify_container_get((hpdata_t *)in_RSI), _Var1)) {
    _Var1 = hpdata_hugify_allowed_get((hpdata_t *)in_RSI);
    if ((!_Var1) && (_Var1 = hpdata_in_psset_hugify_container_get((hpdata_t *)in_RSI), _Var1)) {
      hpdata_in_psset_hugify_container_set((hpdata_t *)in_RSI,false);
      hpdata_hugify_list_remove
                ((hpdata_hugify_list_t *)&in_RDI[0x15].ql_link_purge,(hpdata_t *)in_RSI);
    }
  }
  else {
    hpdata_in_psset_hugify_container_set((hpdata_t *)in_RSI,true);
    hpdata_hugify_list_append
              ((hpdata_hugify_list_t *)&in_RDI[0x15].ql_link_purge,(hpdata_t *)in_RSI);
  }
  hpdata_assert_consistent((hpdata_t *)in_RSI);
  return;
}

Assistant:

void
psset_update_end(psset_t *psset, hpdata_t *ps) {
	assert(hpdata_in_psset_get(ps));
	hpdata_updating_set(ps, false);
	psset_stats_insert(psset, ps);

	/*
	 * The update begin should have removed ps from whatever alloc container
	 * it was in.
	 */
	assert(!hpdata_in_psset_alloc_container_get(ps));
	if (hpdata_alloc_allowed_get(ps)) {
		psset_alloc_container_insert(psset, ps);
	}
	psset_maybe_insert_purge_list(psset, ps);

	if (hpdata_hugify_allowed_get(ps)
	    && !hpdata_in_psset_hugify_container_get(ps)) {
		hpdata_in_psset_hugify_container_set(ps, true);
		hpdata_hugify_list_append(&psset->to_hugify, ps);
	} else if (!hpdata_hugify_allowed_get(ps)
	    && hpdata_in_psset_hugify_container_get(ps)) {
		hpdata_in_psset_hugify_container_set(ps, false);
		hpdata_hugify_list_remove(&psset->to_hugify, ps);
	}
	hpdata_assert_consistent(ps);
}